

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cc
# Opt level: O2

void __thiscall Worker::~Worker(Worker *this)

{
  this->alive_ = false;
  std::thread::join();
  close(this->socketfd_);
  std::
  deque<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ::~deque(&this->work_);
  std::thread::~thread(&this->thread);
  return;
}

Assistant:

Worker::~Worker()
{
    this->stop();
    this->thread.join();
    close(this->socketfd_);
}